

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

void __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::calculateIntersections(ComplexToSimple *this)

{
  int iVar1;
  bool bVar2;
  Event *pEVar3;
  Edge *pEVar4;
  int *piVar5;
  Node *pNVar6;
  Node *pNVar7;
  long in_RDI;
  long in_FS_OFFSET;
  QPodPoint in_stack_00000008;
  Node *right_1;
  Node *left_1;
  Node *right;
  Node *left;
  int i;
  int vertex;
  Node *leftNode;
  QIntersectionPoint eventPoint;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> range;
  Event event;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 uVar8;
  Node *in_stack_fffffffffffffee0;
  ComplexToSimple *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Node *in_stack_ffffffffffffff00;
  ComplexToSimple *in_stack_ffffffffffffff08;
  ComplexToSimple *in_stack_ffffffffffffff10;
  ComplexToSimple *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff20;
  int iVar9;
  ComplexToSimple *in_stack_ffffffffffffff38;
  ComplexToSimple *in_stack_ffffffffffffff40;
  QPodPoint *in_stack_ffffffffffffff70;
  ComplexToSimple *in_stack_ffffffffffffff78;
  undefined4 local_58;
  undefined4 local_54;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> local_30;
  QPodPoint local_20;
  QPodPoint local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fillPriorityQueue(in_stack_ffffffffffffff38);
  while (bVar2 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::isEmpty
                           ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)
                            (in_RDI + 0x30)), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_18 = (QPodPoint)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pEVar3 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::last
                       ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)
                        (in_RDI + 0x30));
    local_20 = pEVar3->point;
    local_10._0_4_ = pEVar3->type;
    local_10._4_4_ = pEVar3->edge;
    local_18 = local_20;
    sortEdgeList(in_stack_ffffffffffffff40,in_stack_00000008);
    local_30.second = (Node *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.first = (Node *)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = bounds(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (local_30.first != (Node *)0x0) {
      QRBTree<int>::previous((QRBTree<int> *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    }
    if ((int)local_10 == 0) {
      pEVar4 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                          (in_RDI + 8),(long)local_10._4_4_);
      piVar5 = Edge::upper(pEVar4);
      iVar9 = *piVar5;
    }
    else {
      pEVar4 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                          (in_RDI + 8),(long)local_10._4_4_);
      piVar5 = Edge::lower(pEVar4);
      iVar9 = *piVar5;
    }
    memset(&local_58,0,0x28);
    local_58 = 0xaaaaaaaa;
    local_54 = 0xaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    qIntersectionPoint((QPodPoint *)in_stack_fffffffffffffee0);
    if (local_30.first != (Node *)0x0) {
      splitEdgeListRange(in_stack_ffffffffffffff18,(Node *)in_stack_ffffffffffffff10,
                         (Node *)in_stack_ffffffffffffff08,
                         (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                         (QIntersectionPoint *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      reorderEdgeListRange
                (in_stack_ffffffffffffff10,(Node *)in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
    }
    while( true ) {
      bVar2 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::isEmpty
                        ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)
                         (in_RDI + 0x30));
      in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 & 0xffffff;
      if (!bVar2) {
        pEVar3 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::last
                           ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)
                            (in_RDI + 0x30));
        bVar2 = QPodPoint::operator==(&pEVar3->point,&local_18);
        in_stack_ffffffffffffff20 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff20);
      }
      if ((char)(in_stack_ffffffffffffff20 >> 0x18) == '\0') break;
      pEVar3 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::last
                         ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)
                          (in_RDI + 0x30));
      local_18 = pEVar3->point;
      local_10._0_4_ = pEVar3->type;
      local_10._4_4_ = pEVar3->edge;
      QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::pop_back
                ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)
                 (in_RDI + 0x30));
      iVar1 = local_10._4_4_;
      pEVar4 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                          (in_RDI + 8),(long)local_10._4_4_);
      if (pEVar4->node == (Node *)0x0) {
        in_stack_fffffffffffffee8 =
             (ComplexToSimple *)
             searchEdgeLeftOf(in_stack_ffffffffffffff08,
                              (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                              (Node *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
        ;
        in_stack_fffffffffffffee0 = (Node *)(in_RDI + 0x20);
        in_stack_ffffffffffffff40 = in_stack_fffffffffffffee8;
        pNVar6 = QRBTree<int>::newNode((QRBTree<int> *)in_stack_fffffffffffffee8);
        pEVar4 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                           ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                            (in_RDI + 8),(long)iVar1);
        pEVar4->node = pNVar6;
        QRBTree<int>::attachAfter
                  ((QRBTree<int> *)pNVar6,(Node *)in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee0);
        in_stack_fffffffffffffefc = iVar1;
        pEVar4 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                           ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                            (in_RDI + 8),(long)iVar1);
        pEVar4->node->data = in_stack_fffffffffffffefc;
        in_stack_ffffffffffffff00 = (Node *)(in_RDI + 0x20);
        QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                  ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)(in_RDI + 8)
                   ,(long)iVar1);
        in_stack_ffffffffffffff38 =
             (ComplexToSimple *)
             QRBTree<int>::next((QRBTree<int> *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
        ;
        if (in_stack_ffffffffffffff40 != (ComplexToSimple *)0x0) {
          calculateIntersection(in_stack_ffffffffffffff38,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        }
        if (in_stack_ffffffffffffff38 != (ComplexToSimple *)0x0) {
          calculateIntersection(in_stack_ffffffffffffff38,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        }
      }
      else {
        in_stack_ffffffffffffff08 = (ComplexToSimple *)(in_RDI + 0x20);
        QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                  ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)(in_RDI + 8)
                   ,(long)iVar1);
        pNVar6 = QRBTree<int>::previous
                           ((QRBTree<int> *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        in_stack_ffffffffffffff10 = (ComplexToSimple *)(in_RDI + 0x20);
        QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                  ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)(in_RDI + 8)
                   ,(long)iVar1);
        pNVar7 = QRBTree<int>::next((QRBTree<int> *)in_stack_fffffffffffffee8,
                                    in_stack_fffffffffffffee0);
        in_stack_ffffffffffffff18 = (ComplexToSimple *)(in_RDI + 0x20);
        QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                  ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)(in_RDI + 8)
                   ,(long)iVar1);
        QRBTree<int>::deleteNode
                  ((QRBTree<int> *)in_stack_fffffffffffffee0,
                   (Node **)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        if ((pNVar6 != (Node *)0x0) && (pNVar7 != (Node *)0x0)) {
          calculateIntersection(in_stack_ffffffffffffff38,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        }
      }
    }
    while( true ) {
      bVar2 = QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::isEmpty
                        ((QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *)
                         0x687365);
      uVar8 = false;
      if (!bVar2) {
        QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::top
                  ((QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *)
                   0x687380);
        uVar8 = QIntersectionPoint::operator<=
                          ((QIntersectionPoint *)in_stack_fffffffffffffee0,
                           (QIntersectionPoint *)CONCAT17(uVar8,in_stack_fffffffffffffed8));
      }
      if ((bool)uVar8 == false) break;
      QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::pop
                ((QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *)
                 CONCAT44(iVar9,in_stack_ffffffffffffff20));
    }
    in_stack_fffffffffffffedf = 0;
  }
  QInt64Set::clear((QInt64Set *)(in_RDI + 0x78));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulator<T>::ComplexToSimple::calculateIntersections()
{
    fillPriorityQueue();

    Q_ASSERT(m_topIntersection.empty());
    Q_ASSERT(m_edgeList.root == nullptr);

    // Find all intersection points.
    while (!m_events.isEmpty()) {
        Event event = m_events.last();
        sortEdgeList(event.point);

        // Find all edges in the edge list that contain the current vertex and mark them to be split later.
        std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> range = bounds(event.point);
        QRBTree<int>::Node *leftNode = range.first ? m_edgeList.previous(range.first) : nullptr;
        int vertex = (event.type == Event::Upper ? m_edges.at(event.edge).upper() : m_edges.at(event.edge).lower());
        QIntersectionPoint eventPoint = QT_PREPEND_NAMESPACE(qIntersectionPoint)(event.point);

        if (range.first != nullptr) {
            splitEdgeListRange(range.first, range.second, vertex, eventPoint);
            reorderEdgeListRange(range.first, range.second);
        }

        // Handle the edges with start or end point in the current vertex.
        while (!m_events.isEmpty() && m_events.last().point == event.point) {
            event = m_events.last();
            m_events.pop_back();
            int i = event.edge;

            if (m_edges.at(i).node) {
                // Remove edge from edge list.
                Q_ASSERT(event.type == Event::Lower);
                QRBTree<int>::Node *left = m_edgeList.previous(m_edges.at(i).node);
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                m_edgeList.deleteNode(m_edges.at(i).node);
                if (!left || !right)
                    continue;
                calculateIntersection(left->data, right->data);
            } else {
                // Insert edge into edge list.
                Q_ASSERT(event.type == Event::Upper);
                QRBTree<int>::Node *left = searchEdgeLeftOf(i, leftNode);
                m_edgeList.attachAfter(left, m_edges.at(i).node = m_edgeList.newNode());
                m_edges.at(i).node->data = i;
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                if (left)
                    calculateIntersection(left->data, i);
                if (right)
                    calculateIntersection(i, right->data);
            }
        }
        while (!m_topIntersection.isEmpty() && m_topIntersection.top().intersectionPoint <= eventPoint)
            m_topIntersection.pop();
#ifdef Q_TRIANGULATOR_DEBUG
        DebugDialog dialog(this, vertex);
        dialog.exec();
#endif
    }
    m_processedEdgePairs.clear();
}